

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

NodeBase ** __thiscall
google::protobuf::internal::UntypedMapBase::CreateEmptyTable(UntypedMapBase *this,map_index_t n)

{
  void *__s;
  NodeBase **ppNVar1;
  ulong n_00;
  
  if (n < 2) {
    CreateEmptyTable();
  }
  else if ((n - 1 & n) == 0) {
    n_00 = (ulong)n << 3;
    if (this->arena_ == (Arena *)0x0) {
      __s = operator_new(n_00);
    }
    else {
      __s = Arena::AllocateForArray(this->arena_,n_00);
    }
    ppNVar1 = (NodeBase **)memset(__s,0,n_00);
    return ppNVar1;
  }
  CreateEmptyTable();
}

Assistant:

NodeBase** CreateEmptyTable(map_index_t n) {
    ABSL_DCHECK_GE(n, kMinTableSize);
    ABSL_DCHECK_EQ(n & (n - 1), 0u);
    NodeBase** result =
        arena_ == nullptr
            ? static_cast<NodeBase**>(::operator new(n * sizeof(NodeBase*)))
            : Arena::CreateArray<NodeBase*>(arena_, n);
    memset(result, 0, n * sizeof(result[0]));
    return result;
  }